

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O0

point3d * tinyusdz::vnormalize(point3d *__return_storage_ptr__,point3d *a,double eps)

{
  double dVar1;
  double local_38;
  double len;
  double eps_local;
  point3d *a_local;
  
  dVar1 = vlength(a);
  local_38 = eps;
  if (eps < dVar1) {
    local_38 = dVar1;
  }
  dVar1 = value::point3d::operator[](a,0);
  __return_storage_ptr__->x = dVar1 / local_38;
  dVar1 = value::point3d::operator[](a,1);
  __return_storage_ptr__->y = dVar1 / local_38;
  dVar1 = value::point3d::operator[](a,2);
  __return_storage_ptr__->z = dVar1 / local_38;
  return __return_storage_ptr__;
}

Assistant:

value::point3d vnormalize(const value::point3d &a, const double eps) {
  double len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::point3d({a[0] / len, a[1] / len, a[2] / len});
}